

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O3

void __thiscall
slang::ast::ParameterBuilder::createDecls
          (ParameterBuilder *this,Scope *scope,ParameterDeclarationBaseSyntax *syntax,bool isLocal,
          bool isPort,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes,SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *results)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  ParameterDeclarationSyntax *paramSyntax;
  ulong uVar2;
  undefined1 *puVar3;
  undefined7 in_register_00000081;
  long lVar4;
  bool local_42;
  bool local_41;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> local_40;
  
  local_40._M_ptr = (pointer)CONCAT71(in_register_00000081,isPort);
  local_41 = SUB81(syntax,0);
  local_42 = isLocal;
  local_40._M_extent._M_extent_value = (size_t)results;
  if (*(int *)&scope->compilation == 0x15e) {
    uVar2 = *(long *)&scope[1].deferredMemberIndex + 1;
    if (1 < uVar2) {
      uVar2 = uVar2 >> 1;
      lVar4 = 0;
      do {
        ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(scope[1].lastMember)->kind + lVar4));
        SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
        emplace_back<slang::ast::Scope_const&,slang::syntax::ParameterDeclarationSyntax_const&,slang::syntax::DeclaratorSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
                  ((SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)attributes._M_ptr
                   ,(Scope *)this,(ParameterDeclarationSyntax *)scope,(DeclaratorSyntax *)*ppSVar1,
                   &local_41,&local_42,&local_40);
        lVar4 = lVar4 + 0x30;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  else {
    puVar3 = (undefined1 *)((long)&((scope[2].compilation)->super_BumpAllocator).head + 1);
    if ((undefined1 *)0x1 < puVar3) {
      uVar2 = (ulong)puVar3 >> 1;
      lVar4 = 0;
      do {
        ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&((scope[1].importData)->wildcardImports).
                                     super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar4));
        SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
        emplace_back<slang::ast::Scope_const&,slang::syntax::TypeParameterDeclarationSyntax_const&,slang::syntax::TypeAssignmentSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
                  ((SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)attributes._M_ptr
                   ,(Scope *)this,(TypeParameterDeclarationSyntax *)scope,
                   (TypeAssignmentSyntax *)*ppSVar1,&local_41,&local_42,&local_40);
        lVar4 = lVar4 + 0x30;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  return;
}

Assistant:

void ParameterBuilder::createDecls(const Scope& scope, const ParameterDeclarationBaseSyntax& syntax,
                                   bool isLocal, bool isPort,
                                   std::span<const AttributeInstanceSyntax* const> attributes,
                                   SmallVectorBase<Decl>& results) {
    if (syntax.kind == SyntaxKind::ParameterDeclaration) {
        auto& paramSyntax = syntax.as<ParameterDeclarationSyntax>();
        for (auto decl : paramSyntax.declarators)
            results.emplace_back(scope, paramSyntax, *decl, isLocal, isPort, attributes);
    }
    else {
        auto& paramSyntax = syntax.as<TypeParameterDeclarationSyntax>();
        for (auto decl : paramSyntax.declarators)
            results.emplace_back(scope, paramSyntax, *decl, isLocal, isPort, attributes);
    }
}